

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::ComputeBuiltinVarCase
          (ComputeBuiltinVarCase *this,TestContext *context,char *name,char *varName,
          DataType varType)

{
  char *pcVar1;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  DataType local_2c;
  char *pcStack_28;
  DataType varType_local;
  char *varName_local;
  char *name_local;
  TestContext *context_local;
  ComputeBuiltinVarCase *this_local;
  
  local_2c = varType;
  pcStack_28 = varName;
  varName_local = name;
  name_local = (char *)context;
  context_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  pcVar1 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
  TestCase::TestCase(&this->super_TestCase,context,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_0166b890;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::vector(&this->m_subCases);
  pcVar1 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,pcVar1,&local_8a);
  std::allocator<char>::~allocator(&local_8a);
  this->m_varType = local_2c;
  this->m_subCaseNdx = 0;
  return;
}

Assistant:

ComputeBuiltinVarCase::ComputeBuiltinVarCase (tcu::TestContext& context, const char* name, const char* varName, glu::DataType varType)
	: TestCase		(context, name, varName)
	, m_varName		(varName)
	, m_varType		(varType)
	, m_subCaseNdx	(0)
{
}